

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O1

void __thiscall cmDebugger::cmDebuggerVariables::~cmDebuggerVariables(cmDebuggerVariables *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_cmDebuggerVariables = (_func_int **)&PTR_HandleVariablesRequest_00aacdc0;
  std::
  vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  ::clear(&this->SubVariables);
  cmDebuggerVariablesManager::UnregisterHandler
            ((this->VariablesManager).
             super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,this->Id);
  this_00 = (this->VariablesManager).
            super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  ::~vector(&this->SubVariables);
  p_Var1 = (this->GetKeyValuesFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->GetKeyValuesFunction,(_Any_data *)&this->GetKeyValuesFunction,
              __destroy_functor);
  }
  pcVar2 = (this->Value)._M_dataplus._M_p;
  paVar3 = &(this->Value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->Name)._M_dataplus._M_p;
  paVar3 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmDebuggerVariables::~cmDebuggerVariables()
{
  ClearSubVariables();
  VariablesManager->UnregisterHandler(Id);
}